

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int64_t pixel_diff_stats(MACROBLOCK *x,int plane,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                        BLOCK_SIZE tx_bsize,uint *block_mse_q8,int64_t *per_px_mean,
                        uint64_t *block_var)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  double dVar4;
  undefined1 auVar5 [16];
  undefined4 *in_stack_00000008;
  long *in_stack_00000010;
  long *in_stack_00000018;
  int sign_sum;
  double norm_factor;
  int sum;
  uint64_t sse;
  int16_t *diff;
  int diff_stride;
  MACROBLOCKD *xd;
  int visible_cols;
  int visible_rows;
  int in_stack_ffffffffffffffac;
  MACROBLOCKD *in_stack_ffffffffffffffb0;
  int local_44;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_20;
  int local_1c;
  
  get_txb_dimensions(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     (BLOCK_SIZE)((uint)in_ESI >> 0x18),in_EDX,in_ECX,
                     (BLOCK_SIZE)((uint)in_R8D >> 0x18),in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffc8,
                     (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int *)(in_RDI + 0x1a0));
  local_44 = 0;
  uVar2 = (*aom_sum_sse_2d_i16)
                    ((int16_t *)
                     (*(long *)(in_RDI + (long)in_ESI * 0x88) +
                     (long)(int)((in_EDX * (uint)block_size_wide[(byte)in_R8D] + in_ECX) * 4) * 2),
                     (uint)block_size_wide[(byte)in_R8D],local_20,local_1c,&local_44);
  if ((local_20 < 1) || (local_1c < 1)) {
    *in_stack_00000008 = 0xffffffff;
  }
  else {
    dVar4 = 1.0 / (double)(local_20 * local_1c);
    iVar1 = local_44;
    if (local_44 < 1) {
      iVar1 = -local_44;
    }
    *in_stack_00000010 = (long)(dVar4 * (double)iVar1) << 7;
    *in_stack_00000010 =
         (long)(int)(((0 < local_44) - 1) + (uint)(0 < local_44)) * *in_stack_00000010;
    auVar5._8_4_ = (int)(uVar2 >> 0x18);
    auVar5._0_8_ = uVar2 << 8;
    auVar5._12_4_ = 0x45300000;
    *in_stack_00000008 =
         (int)(long)(dVar4 * ((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)(uVar2 << 8)) - 4503599627370496.0)))
    ;
    dVar4 = dVar4 * (double)local_44 * (double)local_44;
    uVar3 = (ulong)dVar4;
    *in_stack_00000018 =
         uVar2 - (uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f);
  }
  return uVar2;
}

Assistant:

static inline int64_t pixel_diff_stats(
    MACROBLOCK *x, int plane, int blk_row, int blk_col,
    const BLOCK_SIZE plane_bsize, const BLOCK_SIZE tx_bsize,
    unsigned int *block_mse_q8, int64_t *per_px_mean, uint64_t *block_var) {
  int visible_rows, visible_cols;
  const MACROBLOCKD *xd = &x->e_mbd;
  get_txb_dimensions(xd, plane, plane_bsize, blk_row, blk_col, tx_bsize, NULL,
                     NULL, &visible_cols, &visible_rows);
  const int diff_stride = block_size_wide[plane_bsize];
  const int16_t *diff = x->plane[plane].src_diff;

  diff += ((blk_row * diff_stride + blk_col) << MI_SIZE_LOG2);
  uint64_t sse = 0;
  int sum = 0;
  sse = aom_sum_sse_2d_i16(diff, diff_stride, visible_cols, visible_rows, &sum);
  if (visible_cols > 0 && visible_rows > 0) {
    double norm_factor = 1.0 / (visible_cols * visible_rows);
    int sign_sum = sum > 0 ? 1 : -1;
    // Conversion to transform domain
    *per_px_mean = (int64_t)(norm_factor * abs(sum)) << 7;
    *per_px_mean = sign_sum * (*per_px_mean);
    *block_mse_q8 = (unsigned int)(norm_factor * (256 * sse));
    *block_var = (uint64_t)(sse - (uint64_t)(norm_factor * sum * sum));
  } else {
    *block_mse_q8 = UINT_MAX;
  }
  return sse;
}